

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O0

word Abc_Isop6Cover(word uOn,word uOnDc,word *pRes,int nVars,word CostLim,int *pCover)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *Cost;
  ulong uVar4;
  word wVar5;
  ulong uOnDc_00;
  word wVar6;
  ulong uVar7;
  int *local_f0;
  int *local_c0;
  int local_94;
  int Var;
  word Cost2;
  word Cost1;
  word Cost0;
  word uRes2;
  word uRes1;
  word uRes0;
  word uOnDc1;
  word uOnDc0;
  word uOn1;
  word uOn0;
  int *pCover_local;
  word CostLim_local;
  word *pwStack_28;
  int nVars_local;
  word *pRes_local;
  word uOnDc_local;
  word uOn_local;
  
  uOn0 = (word)pCover;
  pCover_local = (int *)CostLim;
  CostLim_local._4_4_ = nVars;
  pwStack_28 = pRes;
  pRes_local = (word *)uOnDc;
  uOnDc_local = uOn;
  if (6 < nVars) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                  ,0x70,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
  }
  if ((uOn & (uOnDc ^ 0xffffffffffffffff)) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                  ,0x71,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
  }
  if (uOn == 0) {
    *pRes = 0;
    uOn_local = 0;
  }
  else if (uOnDc == 0xffffffffffffffff) {
    *pRes = 0xffffffffffffffff;
    if (pCover != (int *)0x0) {
      *pCover = 0;
    }
    uOn_local = Abc_Cube2Cost(1);
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                    ,0x7d,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
    }
    local_94 = nVars + -1;
    while (((-1 < local_94 && (iVar2 = Abc_Tt6HasVar(uOnDc_local,local_94), iVar2 == 0)) &&
           (iVar2 = Abc_Tt6HasVar((word)pRes_local,local_94), iVar2 == 0))) {
      local_94 = local_94 + -1;
    }
    if (local_94 < 0) {
      __assert_fail("Var >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                    ,0x82,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
    }
    uOn1 = Abc_Tt6Cofactor0(uOnDc_local,local_94);
    uOnDc0 = Abc_Tt6Cofactor1(uOnDc_local,local_94);
    uOnDc1 = Abc_Tt6Cofactor0((word)pRes_local,local_94);
    uRes0 = Abc_Tt6Cofactor1((word)pRes_local,local_94);
    Cost = (int *)Abc_Isop6Cover(uOn1 & (uRes0 ^ 0xffffffffffffffff),uOnDc1,&uRes1,local_94,
                                 (word)pCover_local,(int *)uOn0);
    piVar1 = pCover_local;
    wVar5 = uOn0;
    wVar6 = uRes0;
    if (Cost < pCover_local) {
      uVar4 = uOnDc0 & (uOnDc1 ^ 0xffffffffffffffff);
      if (uOn0 == 0) {
        local_c0 = (int *)0x0;
      }
      else {
        iVar2 = Abc_CostCubes((word)Cost);
        local_c0 = (int *)(wVar5 + (long)iVar2 * 4);
      }
      wVar5 = Abc_Isop6Cover(uVar4,wVar6,&uRes2,local_94,(word)piVar1,local_c0);
      piVar1 = pCover_local;
      wVar6 = uOn0;
      if ((int *)((long)Cost + wVar5) < pCover_local) {
        uVar4 = uOn1 & (uRes1 ^ 0xffffffffffffffff);
        uVar7 = uOnDc0 & (uRes2 ^ 0xffffffffffffffff);
        uOnDc_00 = uOnDc1 & uRes0;
        if (uOn0 == 0) {
          local_f0 = (int *)0x0;
        }
        else {
          iVar2 = Abc_CostCubes((word)Cost);
          iVar3 = Abc_CostCubes(wVar5);
          local_f0 = (int *)(wVar6 + (long)iVar2 * 4 + (long)iVar3 * 4);
        }
        wVar6 = Abc_Isop6Cover(uVar4 | uVar7,uOnDc_00,&Cost0,local_94,(word)piVar1,local_f0);
        if ((int *)((long)Cost + wVar6 + wVar5) < pCover_local) {
          *pwStack_28 = Cost0 | uRes1 & s_Truths6Neg[local_94] | uRes2 & s_Truths6[local_94];
          if (((uOnDc_local & (*pwStack_28 ^ 0xffffffffffffffff)) != 0) ||
             ((*pwStack_28 & ((ulong)pRes_local ^ 0xffffffffffffffff)) != 0)) {
            __assert_fail("(uOn & ~*pRes) == 0 && (*pRes & ~uOnDc) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                          ,0x91,"word Abc_Isop6Cover(word, word, word *, int, word, int *)");
          }
          Abc_IsopAddLits((int *)uOn0,(word)Cost,wVar5,local_94);
          iVar2 = Abc_CostCubes((word)Cost);
          iVar3 = Abc_CostCubes(wVar5);
          uOn_local = (long)Cost + (long)iVar3 + (long)iVar2 + wVar6 + wVar5;
        }
        else {
          uOn_local = (word)pCover_local;
        }
      }
      else {
        uOn_local = (word)pCover_local;
      }
    }
    else {
      uOn_local = (word)pCover_local;
    }
  }
  return uOn_local;
}

Assistant:

word Abc_Isop6Cover( word uOn, word uOnDc, word * pRes, int nVars, word CostLim, int * pCover )
{
    word uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    word Cost0, Cost1, Cost2;  int Var; 
    assert( nVars <= 6 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
    {
        pRes[0] = 0;
        return 0;
    }
    if ( uOnDc == ~(word)0 )
    {
        pRes[0] = ~(word)0;
        if ( pCover ) pCover[0] = 0;
        return Abc_Cube2Cost(1);
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( uOn, Var ) || Abc_Tt6HasVar( uOnDc, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = Abc_Tt6Cofactor0( uOn,   Var );
    uOn1   = Abc_Tt6Cofactor1( uOn  , Var );
    uOnDc0 = Abc_Tt6Cofactor0( uOnDc, Var );
    uOnDc1 = Abc_Tt6Cofactor1( uOnDc, Var );
    // solve for cofactors
    Cost0 = Abc_Isop6Cover( uOn0 & ~uOnDc1, uOnDc0, &uRes0, Var, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    Cost1 = Abc_Isop6Cover( uOn1 & ~uOnDc0, uOnDc1, &uRes1, Var, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    Cost2 = Abc_Isop6Cover( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, &uRes2, Var, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    *pRes = uRes2 | (uRes0 & s_Truths6Neg[Var]) | (uRes1 & s_Truths6[Var]);
    assert( (uOn & ~*pRes) == 0 && (*pRes & ~uOnDc) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, Var );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}